

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_test.c
# Opt level: O0

void vdpp_test(VdppTestCfg *cfg)

{
  int iVar1;
  uint uVar2;
  RK_S32 fd;
  RK_S32 fd_00;
  undefined4 uVar3;
  void *__ptr;
  RK_U8 *dat;
  RK_U8 *p_pack_hist_addr;
  RK_U32 *p_hist_local;
  RK_U32 *p_hist_global;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  MppBuffer pvVar7;
  ulong uVar8;
  bool bVar9;
  RK_S32 RVar10;
  size_t sVar11;
  MppBuffer pvVar12;
  bool local_665;
  undefined1 local_660 [4];
  RK_S32 cap;
  DataCrc checkcrc;
  RK_U32 cnt;
  MPP_RET ret;
  MppBufferGroup memGroup;
  uint local_630;
  RK_U32 global_hist_size;
  RK_U32 local_hist_size;
  VdppImg imgdst_c;
  VdppImg imgdst;
  VdppImg imgsrc;
  RK_U32 yuv_out_diff;
  RK_U32 is_vdpp2;
  vdpp_api_params params;
  RK_S32 fdhist;
  RK_S32 fddst_c;
  RK_S32 fddst;
  RK_S32 fdsrc;
  RK_U8 *phist_g;
  RK_U8 *phist_l;
  RK_U8 *phist;
  RK_U8 *pdst_c;
  RK_U8 *pdst;
  RK_U8 *psrc;
  MppBuffer histbuf_g;
  MppBuffer histbuf_l;
  MppBuffer histbuf;
  MppBuffer dstbuf_c;
  MppBuffer dstbuf;
  MppBuffer srcbuf;
  size_t dstfrmsize_c;
  size_t dstfrmsize;
  size_t srcfrmsize;
  vdpp_com_ctx *vdpp;
  VdppTestCfg *cfg_local;
  
  vdpp = (vdpp_com_ctx *)cfg;
  srcfrmsize = (size_t)rockchip_vdpp_api_alloc_ctx();
  dstfrmsize = get_src_frm_size(*(RK_S32 *)&vdpp->ops,*(RK_U32 *)((long)&vdpp->priv + 4),vdpp->ver);
  dstfrmsize_c = get_dst_frm_size(vdpp[1].ver,*(RK_U32 *)&vdpp[1].priv,
                                  *(RK_U32 *)((long)&vdpp[1].priv + 4));
  srcbuf = (MppBuffer)(ulong)(uint)(*(int *)((long)&vdpp[2].priv + 4) * vdpp[2].ver * 3);
  phist = (RK_U8 *)0x0;
  params.param._1364_4_ = 0xffffffff;
  params.param.sharp.tex_adj_val[5] = -1;
  iVar1 = mpp_get_soc_type();
  bVar9 = iVar1 == 0x19;
  local_665 = *(int *)&vdpp[2].ops != 0 && bVar9;
  uVar2 = (uint)local_665;
  local_630 = 0x4000;
  memGroup._4_4_ = 0x400;
  if ((srcfrmsize == 0) &&
     (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"vdpp","vdpp_test",0xff),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  checkcrc._20_4_ = 0xffffffff;
  checkcrc.vor = 0;
  memset(local_660,0,0x18);
  checkcrc._0_8_ = mpp_osal_malloc("vdpp_test",0x1000);
  checkcrc._20_4_ = mpp_buffer_group_get(&cnt,3,0,"vdpp_test");
  if (checkcrc._20_4_ != 0) {
    _mpp_log_l(2,"vdpp_test","memGroup mpp_buffer_group_get failed\n",0);
    _mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"0","vdpp_test",0x10b);
    if ((_mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  _mpp_log_l(4,"vdpp_test","src w:h [%d:%d] stride [%d:%d] require buf %d",0,
             *(undefined4 *)((long)&vdpp->ops + 4),*(undefined4 *)&vdpp->priv,
             *(undefined4 *)((long)&vdpp->priv + 4),vdpp->ver,dstfrmsize);
  uVar3 = *(undefined4 *)((long)&vdpp[1].priv + 4);
  sVar11 = dstfrmsize_c;
  _mpp_log_l(4,"vdpp_test","dst w:h [%d:%d] stride [%d:%d] require buf %d",0,
             *(undefined4 *)&vdpp[1].ops,*(undefined4 *)((long)&vdpp[1].ops + 4),
             *(undefined4 *)&vdpp[1].priv,uVar3,dstfrmsize_c);
  mpp_buffer_get_with_tag(_cnt,&dstbuf,dstfrmsize,"vdpp_test");
  mpp_buffer_get_with_tag(_cnt,&dstbuf_c,dstfrmsize_c,"vdpp_test");
  mpp_buffer_get_with_tag(_cnt,&histbuf_l,0x2800,"vdpp_test");
  if ((((dstbuf == (MppBuffer)0x0) || (dstbuf_c == (MppBuffer)0x0)) || (histbuf_l == (MppBuffer)0x0)
      ) && (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,
                       "srcbuf && dstbuf && histbuf","vdpp_test",0x115,uVar3,sVar11),
           (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  mpp_buffer_get_with_tag(_cnt,&histbuf_g,local_630,"vdpp_test");
  mpp_buffer_get_with_tag(_cnt,&psrc,memGroup._4_4_,"vdpp_test");
  if (((histbuf_g == (MppBuffer)0x0) || (psrc == (RK_U8 *)0x0)) &&
     (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"histbuf_l && histbuf_g",
                 "vdpp_test",0x119), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  __ptr = (void *)mpp_buffer_get_ptr_with_caller(dstbuf,"vdpp_test");
  dat = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf_c,"vdpp_test");
  p_pack_hist_addr = (RK_U8 *)mpp_buffer_get_ptr_with_caller(histbuf_l,"vdpp_test");
  p_hist_local = (RK_U32 *)mpp_buffer_get_ptr_with_caller(histbuf_g,"vdpp_test");
  p_hist_global = (RK_U32 *)mpp_buffer_get_ptr_with_caller(psrc,"vdpp_test");
  fd = mpp_buffer_get_fd_with_caller(dstbuf,"vdpp_test");
  fd_00 = mpp_buffer_get_fd_with_caller(dstbuf_c,"vdpp_test");
  params.param.sharp.tex_adj_val[5] = mpp_buffer_get_fd_with_caller(histbuf_l);
  if (uVar2 != 0) {
    RVar10 = vdpp[2].ver;
    pvVar12 = srcbuf;
    _mpp_log_l(4,"vdpp_test","dst chroma w:h [%d:%d] stride [%d:%d] require buf %d",0,
               *(undefined4 *)((long)&vdpp[2].ops + 4),*(undefined4 *)&vdpp[2].priv,
               *(undefined4 *)((long)&vdpp[2].priv + 4),RVar10,srcbuf);
    mpp_buffer_get_with_tag(_cnt,&histbuf,srcbuf,"vdpp_test");
    if ((histbuf == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"dstbuf_c","vdpp_test",0x12a,
                   RVar10,pvVar12), (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    phist = (RK_U8 *)mpp_buffer_get_ptr_with_caller(histbuf,"vdpp_test");
    params.param._1364_4_ = mpp_buffer_get_fd_with_caller(histbuf);
  }
  (*(code *)**(undefined8 **)srcfrmsize)(srcfrmsize + 8);
  if (bVar9) {
    yuv_out_diff = 0x10;
    memset(&params,0,0x558);
    params.ptype = *(VDPP_PARAM_TYPE *)&vdpp->ops;
    params.param.com.dswap = *(VDPP_YUV_SWAP *)((long)&vdpp->ops + 4);
    params.param.com.src_width = *(undefined4 *)&vdpp->priv;
    params.param.com.src_height = *(RK_S32 *)((long)&vdpp->priv + 4);
    params.param.com.dst_width = vdpp->ver;
    params._4_4_ = *(undefined4 *)&vdpp->field_0x14;
    params.param.com.sswap = vdpp[1].ver;
    params.param.com.dst_height = *(undefined4 *)&vdpp[1].ops;
    params.param.dmsr.wgt_pri_gain_odd_2 = *(RK_U32 *)((long)&vdpp[1].ops + 4);
    params.param.dmsr.wgt_sec_gain = *(undefined4 *)&vdpp[1].priv;
    params.param.dmsr.blk_flat_th = *(RK_U32 *)((long)&vdpp[1].priv + 4);
    if (uVar2 != 0) {
      params.param.dmsr.contrast_to_conf_map_x1 = *(RK_U32 *)((long)&vdpp[2].ops + 4);
      params.param.dmsr.contrast_to_conf_map_y0 = *(undefined4 *)&vdpp[2].priv;
      params.param.dmsr.contrast_to_conf_map_y1 = *(RK_U32 *)((long)&vdpp[2].priv + 4);
      params.param.dmsr.diff_core_th0 = vdpp[2].ver;
      params.param.dmsr.contrast_to_conf_map_x0 = uVar2;
    }
    params.param.com.dfmt = *(undefined4 *)&vdpp[1].field_0x14;
    params.param.dmsr.diff_core_th1 = *(RK_U32 *)((long)&vdpp[0x50].ops + 4);
    params.param.dmsr.diff_core_wgt0 = *(undefined4 *)&vdpp[2].field_0x14;
    (**(code **)(*(long *)srcfrmsize + 0x10))(*(undefined8 *)(srcfrmsize + 8),0x2000,&yuv_out_diff);
  }
  else {
    yuv_out_diff = 0;
    memset(&params,0,0x558);
    params.param.com.dfmt = *(VDPP_FMT *)((long)&vdpp->ops + 4);
    params.param.com.dswap = *(undefined4 *)&vdpp->priv;
    params.ptype = *(VDPP_PARAM_TYPE *)&vdpp->field_0x14;
    params._4_4_ = vdpp[1].ver;
    params.param.com.src_width = *(undefined4 *)&vdpp[1].ops;
    params.param.com.src_height = *(RK_S32 *)((long)&vdpp[1].ops + 4);
    params.param.com.sswap = *(undefined4 *)&vdpp[1].field_0x14;
    (**(code **)(*(long *)srcfrmsize + 0x10))(*(undefined8 *)(srcfrmsize + 8),3,&yuv_out_diff);
  }
  uVar3 = (**(code **)(*(long *)srcfrmsize + 0x20))(*(undefined8 *)(srcfrmsize + 8));
  _mpp_log_l(4,"vdpp_test","vdpp cap %d\n",0,uVar3);
  do {
    sVar11 = dstfrmsize;
    sVar4 = fread(__ptr,1,dstfrmsize,*(FILE **)&vdpp[0x4d].ver);
    if (sVar4 < sVar11) {
      _mpp_log_l(4,"vdpp_test","source exhaused\n",0);
LAB_00104181:
      mpp_buffer_put_with_caller(dstbuf,"vdpp_test");
      mpp_buffer_put_with_caller(dstbuf_c,"vdpp_test");
      mpp_buffer_put_with_caller(histbuf_l,"vdpp_test");
      if (histbuf_g != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(histbuf_g,"vdpp_test");
      }
      if (psrc != (RK_U8 *)0x0) {
        mpp_buffer_put_with_caller(psrc,"vdpp_test");
      }
      if (uVar2 != 0) {
        mpp_buffer_put_with_caller(histbuf,"vdpp_test");
      }
      if (checkcrc._0_8_ != 0) {
        mpp_osal_free("vdpp_test",checkcrc._0_8_);
      }
      checkcrc.len = 0;
      checkcrc.sum_cnt = 0;
      if (_cnt != 0) {
        mpp_buffer_group_put(_cnt);
        _cnt = 0;
      }
      (**(code **)(*(long *)srcfrmsize + 8))(*(undefined8 *)(srcfrmsize + 8));
      rockchip_vdpp_api_release_ctx((vdpp_com_ctx *)srcfrmsize);
      return;
    }
    if (*(uint *)&vdpp[0x50].ops <= checkcrc.vor) goto LAB_00104181;
    vdpp_test_set_img((vdpp_com_ctx *)srcfrmsize,*(RK_U32 *)((long)&vdpp->priv + 4),vdpp->ver,
                      (VdppImg *)&imgdst.uv_addr,fd,VDPP_CMD_SET_SRC);
    vdpp_test_set_img((vdpp_com_ctx *)srcfrmsize,*(RK_U32 *)&vdpp[1].priv,
                      *(RK_U32 *)((long)&vdpp[1].priv + 4),(VdppImg *)&imgdst_c.uv_addr,fd_00,
                      VDPP_CMD_SET_DST);
    if (uVar2 != 0) {
      vdpp_test_set_img((vdpp_com_ctx *)srcfrmsize,*(RK_U32 *)((long)&vdpp[2].priv + 4),vdpp[2].ver,
                        (VdppImg *)&global_hist_size,params.param._1364_4_,VDPP_CMD_SET_DST_C);
    }
    if (bVar9) {
      (**(code **)(*(long *)srcfrmsize + 0x10))
                (*(undefined8 *)(srcfrmsize + 8),0x2002,(undefined1 *)((long)&params.param + 0x550))
      ;
    }
    memset(dat,0,dstfrmsize_c);
    memset(p_pack_hist_addr,0,0x2800);
    iVar1 = (**(code **)(*(long *)srcfrmsize + 0x10))(*(undefined8 *)(srcfrmsize + 8),0x1000,0);
    sVar11 = dstfrmsize_c;
    if (iVar1 != 0) {
      _mpp_log_l(2,"vdpp_test","found vdpp run error, exit!\n",0);
      goto LAB_00104181;
    }
    checkcrc.vor = checkcrc.vor + 1;
    if ((vdpp[0x4e].ops != (vdpp_com_ops *)0x0) &&
       (sVar4 = fwrite(dat,1,dstfrmsize_c,(FILE *)vdpp[0x4e].ops), sVar4 < sVar11)) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      _mpp_log_l(2,"vdpp_test","destination dump failed, errno %d %s\n",0,iVar1,pcVar6);
      goto LAB_00104181;
    }
    pvVar12 = srcbuf;
    if (((uVar2 != 0) && (vdpp[0x4e].priv != (VdppCtx)0x0)) &&
       (pvVar7 = (MppBuffer)fwrite(phist,1,(size_t)srcbuf,(FILE *)vdpp[0x4e].priv), pvVar7 < pvVar12
       )) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      _mpp_log_l(2,"vdpp_test","chroma dump failed, errno %d %s\n",0,iVar1,pcVar6);
      goto LAB_00104181;
    }
    if ((*(long *)&vdpp[0x4e].ver != 0) &&
       (sVar4 = fwrite(p_pack_hist_addr,1,0x2800,*(FILE **)&vdpp[0x4e].ver), sVar4 < 0x2800)) {
      _mpp_log_l(2,"vdpp_test","packed hist dump err\n",0);
      goto LAB_00104181;
    }
    memset(p_hist_local,0,(ulong)local_630);
    memset(p_hist_global,0,(ulong)memGroup._4_4_);
    dci_hist_info_parser(p_pack_hist_addr,p_hist_local,p_hist_global);
    if ((vdpp[0x4f].ops != (vdpp_com_ops *)0x0) &&
       (uVar8 = (ulong)local_630,
       sVar4 = fwrite(p_hist_local,1,(ulong)local_630,(FILE *)vdpp[0x4f].ops), sVar4 < uVar8)) {
      _mpp_log_l(2,"vdpp_test","local hist dump err\n",0);
      goto LAB_00104181;
    }
    if ((vdpp[0x4f].priv != (VdppCtx)0x0) &&
       (uVar8 = (ulong)memGroup._4_4_,
       sVar4 = fwrite(p_hist_global,1,(ulong)memGroup._4_4_,(FILE *)vdpp[0x4f].priv), sVar4 < uVar8)
       ) {
      _mpp_log_l(2,"vdpp_test","global hist dump err\n",0);
      goto LAB_00104181;
    }
    if (*(long *)&vdpp[0x4f].ver != 0) {
      if ((dat != (RK_U8 *)0x0) && (*(int *)((long)&vdpp[0x50].ops + 4) == 0)) {
        calc_data_crc(dat,(RK_U32)dstfrmsize_c,(DataCrc *)local_660);
        write_data_crc(*(FILE **)&vdpp[0x4f].ver,(DataCrc *)local_660);
      }
      if (((phist != (RK_U8 *)0x0) && (uVar2 != 0)) && (*(int *)((long)&vdpp[0x50].ops + 4) == 0)) {
        calc_data_crc(phist,(RK_U32)srcbuf,(DataCrc *)local_660);
        write_data_crc(*(FILE **)&vdpp[0x4f].ver,(DataCrc *)local_660);
      }
      if (p_pack_hist_addr != (RK_U8 *)0x0) {
        calc_data_crc(p_pack_hist_addr,0x2800,(DataCrc *)local_660);
        write_data_crc(*(FILE **)&vdpp[0x4f].ver,(DataCrc *)local_660);
      }
    }
  } while( true );
}

Assistant:

void vdpp_test(VdppTestCfg *cfg)
{
    vdpp_com_ctx* vdpp = rockchip_vdpp_api_alloc_ctx();
    size_t srcfrmsize = get_src_frm_size(cfg->src_format, cfg->src_width_vir, cfg->src_height_vir);
    size_t dstfrmsize = get_dst_frm_size(cfg->dst_fmt, cfg->dst_width_vir, cfg->dst_height_vir);
    size_t dstfrmsize_c = cfg->dst_c_width_vir * cfg->dst_c_height_vir * 3;
    MppBuffer srcbuf;
    MppBuffer dstbuf;
    MppBuffer dstbuf_c;
    MppBuffer histbuf;
    MppBuffer histbuf_l;
    MppBuffer histbuf_g;
    RK_U8 *psrc = NULL;
    RK_U8 *pdst = NULL;
    RK_U8 *pdst_c = NULL;
    RK_U8 *phist = NULL;
    RK_U8 *phist_l = NULL;
    RK_U8 *phist_g = NULL;
    RK_S32 fdsrc = -1;
    RK_S32 fddst = -1;
    RK_S32 fddst_c = -1;
    RK_S32 fdhist = -1;
    struct vdpp_api_params params;
    RK_U32 is_vdpp2 = (mpp_get_soc_type() == ROCKCHIP_SOC_RK3576);
    RK_U32 yuv_out_diff = (cfg->yuv_out_diff && is_vdpp2);

    VdppImg imgsrc;
    VdppImg imgdst;
    VdppImg imgdst_c;

    RK_U32 local_hist_size  = RKVOP_PQ_PREPROCESS_HIST_SIZE_VERI * RKVOP_PQ_PREPROCESS_HIST_SIZE_HORI *
                              RKVOP_PQ_PREPROCESS_LOCAL_HIST_BIN_NUMS * sizeof(RK_U32);
    RK_U32 global_hist_size = RKVOP_PQ_PREPROCESS_GLOBAL_HIST_BIN_NUMS * sizeof(RK_U32);

    mpp_assert(vdpp);
    MppBufferGroup memGroup;
    MPP_RET ret = MPP_NOK;
    RK_U32 cnt = 0;
    DataCrc checkcrc;

    memset(&checkcrc, 0, sizeof(checkcrc));
    checkcrc.sum = mpp_malloc(RK_ULONG, 512);

    ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        mpp_assert(0);
    }

    mpp_log("src w:h [%d:%d] stride [%d:%d] require buf %d",
            cfg->src_width, cfg->src_height, cfg->src_width_vir, cfg->src_height_vir, srcfrmsize);
    mpp_log("dst w:h [%d:%d] stride [%d:%d] require buf %d",
            cfg->dst_width, cfg->dst_height, cfg->dst_width_vir, cfg->dst_height_vir, dstfrmsize);
    mpp_buffer_get(memGroup, &srcbuf, srcfrmsize);
    mpp_buffer_get(memGroup, &dstbuf, dstfrmsize);
    mpp_buffer_get(memGroup, &histbuf, DCI_HIST_SIZE);
    mpp_assert(srcbuf && dstbuf && histbuf);

    mpp_buffer_get(memGroup, &histbuf_l, local_hist_size);
    mpp_buffer_get(memGroup, &histbuf_g, global_hist_size);
    mpp_assert(histbuf_l && histbuf_g);

    psrc = mpp_buffer_get_ptr(srcbuf);
    pdst = mpp_buffer_get_ptr(dstbuf);
    phist = mpp_buffer_get_ptr(histbuf);
    phist_l = mpp_buffer_get_ptr(histbuf_l);
    phist_g = mpp_buffer_get_ptr(histbuf_g);

    fdsrc = mpp_buffer_get_fd(srcbuf);
    fddst = mpp_buffer_get_fd(dstbuf);
    fdhist = mpp_buffer_get_fd(histbuf);

    if (yuv_out_diff) {
        mpp_log("dst chroma w:h [%d:%d] stride [%d:%d] require buf %d",
                cfg->dst_c_width, cfg->dst_c_height, cfg->dst_c_width_vir, cfg->dst_c_height_vir, dstfrmsize_c);

        mpp_buffer_get(memGroup, &dstbuf_c, dstfrmsize_c);
        mpp_assert(dstbuf_c);

        pdst_c = mpp_buffer_get_ptr(dstbuf_c);
        fddst_c = mpp_buffer_get_fd(dstbuf_c);
    }

    vdpp->ops->init(&vdpp->priv);

    /* use default dmsr and zme params */
    /* set common params */
    if (is_vdpp2) {
        params.ptype = VDPP_PARAM_TYPE_COM2;
        memset(&params.param, 0, sizeof(union vdpp_api_content));
        params.param.com2.sfmt = cfg->src_format;
        params.param.com2.src_width = cfg->src_width;
        params.param.com2.src_height = cfg->src_height;
        params.param.com2.src_width_vir = cfg->src_width_vir;
        params.param.com2.src_height_vir = cfg->src_height_vir;
        params.param.com2.sswap = cfg->src_swa;
        params.param.com2.dfmt = cfg->dst_fmt;
        params.param.com2.dst_width = cfg->dst_width;
        params.param.com2.dst_height = cfg->dst_height;
        params.param.com2.dst_width_vir = cfg->dst_width_vir;
        params.param.com2.dst_height_vir = cfg->dst_height_vir;
        if (yuv_out_diff) {
            params.param.com2.yuv_out_diff = yuv_out_diff;
            params.param.com2.dst_c_width = cfg->dst_c_width;
            params.param.com2.dst_c_height = cfg->dst_c_height;
            params.param.com2.dst_c_width_vir = cfg->dst_c_width_vir;
            params.param.com2.dst_c_height_vir = cfg->dst_c_height_vir;
        }
        params.param.com2.dswap = cfg->dst_swa;
        params.param.com2.hist_mode_en = cfg->hist_mode_en;
        params.param.com2.cfg_set = cfg->cfg_set;
        vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_COM2_CFG, &params);
    } else {
        params.ptype = VDPP_PARAM_TYPE_COM;
        memset(&params.param, 0, sizeof(union vdpp_api_content));
        params.param.com.src_width = cfg->src_width;
        params.param.com.src_height = cfg->src_height;
        params.param.com.sswap = cfg->src_swa;
        params.param.com.dfmt = cfg->dst_fmt;
        params.param.com.dst_width = cfg->dst_width;
        params.param.com.dst_height = cfg->dst_height;
        params.param.com.dswap = cfg->dst_swa;
        vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_COM_CFG, &params);
    }

    {
        RK_S32 cap = vdpp->ops->check_cap(vdpp->priv);

        mpp_log("vdpp cap %d\n", cap);
    }

    while (1) {
        if (srcfrmsize > fread(psrc, 1, srcfrmsize, cfg->fp_src)) {
            mpp_log("source exhaused\n");
            break;
        }
        if (cnt >= cfg->frame_num)
            break;

        /* notice the order of the input frames */
        vdpp_test_set_img(vdpp, cfg->src_width_vir, cfg->src_height_vir,
                          &imgsrc, fdsrc, VDPP_CMD_SET_SRC);
        vdpp_test_set_img(vdpp, cfg->dst_width_vir, cfg->dst_height_vir,
                          &imgdst, fddst, VDPP_CMD_SET_DST);
        if (yuv_out_diff)
            vdpp_test_set_img(vdpp, cfg->dst_c_width_vir, cfg->dst_c_height_vir,
                              &imgdst_c, fddst_c, VDPP_CMD_SET_DST_C);

        if (is_vdpp2)
            vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_HIST_FD, &fdhist);

        memset(pdst, 0, dstfrmsize);
        memset(phist, 0, DCI_HIST_SIZE);

        if (vdpp->ops->control(vdpp->priv, VDPP_CMD_RUN_SYNC, NULL)) {
            mpp_err("found vdpp run error, exit!\n");
            break;
        }

        cnt++;

        if (cfg->fp_dst) {
            if (dstfrmsize > fwrite(pdst, 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed, errno %d %s\n", errno, strerror(errno));
                break;
            }
        }

        if (yuv_out_diff && cfg->fp_dst_c) {
            if (dstfrmsize_c > fwrite(pdst_c, 1, dstfrmsize_c, cfg->fp_dst_c)) {
                mpp_err("chroma dump failed, errno %d %s\n", errno, strerror(errno));
                break;
            }
        }

        if (cfg->fp_hist) {
            if (DCI_HIST_SIZE > fwrite(phist, 1, DCI_HIST_SIZE, cfg->fp_hist)) {
                mpp_err("packed hist dump err\n");
                break;
            }
        }

        memset(phist_l, 0, local_hist_size);
        memset(phist_g, 0, global_hist_size);

        dci_hist_info_parser(phist, (RK_U32 *)phist_l, (RK_U32 *)phist_g);

        if (cfg->fp_hist_l) {
            if (local_hist_size > fwrite(phist_l, 1, local_hist_size, cfg->fp_hist_l)) {
                mpp_err("local hist dump err\n");
                break;
            }
        }
        if (cfg->fp_hist_g) {
            if (global_hist_size > fwrite(phist_g, 1, global_hist_size, cfg->fp_hist_g)) {
                mpp_err("global hist dump err\n");
                break;
            }
        }

        if (cfg->fp_slt) {
            if (pdst && !cfg->hist_mode_en) {
                calc_data_crc(pdst, dstfrmsize, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);

            }

            if (pdst_c && yuv_out_diff && !cfg->hist_mode_en) {
                calc_data_crc(pdst_c, dstfrmsize_c, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);

            }

            if (phist) {
                calc_data_crc(phist, DCI_HIST_SIZE, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);
            }
        }

    }

    mpp_buffer_put(srcbuf);
    mpp_buffer_put(dstbuf);
    mpp_buffer_put(histbuf);
    if (histbuf_l)
        mpp_buffer_put(histbuf_l);
    if (histbuf_g)
        mpp_buffer_put(histbuf_g);
    if (yuv_out_diff)
        mpp_buffer_put(dstbuf_c);

    MPP_FREE(checkcrc.sum);

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    vdpp->ops->deinit(vdpp->priv);

    rockchip_vdpp_api_release_ctx(vdpp);
}